

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O1

bool __thiscall
vkt::shaderexecutor::
InputLess<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_vkt::shaderexecutor::Void>_>_>
::operator()(InputLess<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_vkt::shaderexecutor::Void>_>_>
             *this,InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_vkt::shaderexecutor::Void>_>
                   *in1,
            InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_vkt::shaderexecutor::Void>_>
            *in2)

{
  bool bVar1;
  bool bVar2;
  Vector<float,_4> *pVVar3;
  Vector<float,_4> *pVVar4;
  InputLess<tcu::Vector<float,_4>_> local_2e;
  InputLess<tcu::Vector<float,_4>_> local_2d;
  InputLess<tcu::Vector<float,_4>_> local_2c;
  InputLess<tcu::Vector<float,_4>_> local_2b;
  InputLess<tcu::Vector<float,_4>_> local_2a;
  InputLess<tcu::Vector<float,_4>_> local_29;
  
  bVar1 = InputLess<tcu::Vector<float,_4>_>::operator()
                    (&local_2e,(Vector<float,_4> *)in1,(Vector<float,_4> *)in2);
  bVar2 = true;
  if (!bVar1) {
    bVar1 = InputLess<tcu::Vector<float,_4>_>::operator()
                      (&local_2d,(Vector<float,_4> *)in2,(Vector<float,_4> *)in1);
    if (!bVar1) {
      pVVar3 = &(in1->
                super_Tuple4<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_vkt::shaderexecutor::Void>
                ).b;
      pVVar4 = &(in2->
                super_Tuple4<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_vkt::shaderexecutor::Void>
                ).b;
      bVar1 = InputLess<tcu::Vector<float,_4>_>::operator()(&local_2c,pVVar3,pVVar4);
      if (bVar1) {
        return true;
      }
      bVar1 = InputLess<tcu::Vector<float,_4>_>::operator()(&local_2b,pVVar4,pVVar3);
      if (!bVar1) {
        pVVar3 = &(in1->
                  super_Tuple4<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_vkt::shaderexecutor::Void>
                  ).c;
        pVVar4 = &(in2->
                  super_Tuple4<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_vkt::shaderexecutor::Void>
                  ).c;
        bVar1 = InputLess<tcu::Vector<float,_4>_>::operator()(&local_2a,pVVar3,pVVar4);
        if (bVar1) {
          return true;
        }
        InputLess<tcu::Vector<float,_4>_>::operator()(&local_29,pVVar4,pVVar3);
      }
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool operator() (const InTuple<In>& in1, const InTuple<In>& in2) const
	{
		if (inputLess(in1.a, in2.a))
			return true;
		if (inputLess(in2.a, in1.a))
			return false;
		if (inputLess(in1.b, in2.b))
			return true;
		if (inputLess(in2.b, in1.b))
			return false;
		if (inputLess(in1.c, in2.c))
			return true;
		if (inputLess(in2.c, in1.c))
			return false;
		if (inputLess(in1.d, in2.d))
			return true;
		return false;
	}